

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

int Gia_ManDumpUntests(Gia_Man_t *pM,Cnf_Dat_t *pCnf,sat_solver *pSat,int nFuncVars,char *pFileName,
                      int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  Vec_Int_t *p;
  int *piVar4;
  Vec_Int_t *pVVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  uint local_58;
  
  __stream = fopen(pFileName,"wb");
  iVar2 = pM->vCis->nSize;
  iVar9 = pM->nRegs + nFuncVars;
  p = (Vec_Int_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < (iVar2 - iVar9) - 1U) {
    iVar3 = iVar2 - iVar9;
  }
  p->nSize = 0;
  p->nCap = iVar3;
  if (iVar3 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)iVar3 << 2);
  }
  p->pArray = piVar4;
  local_58 = 0;
  uVar10 = 0;
LAB_005357cb:
  iVar2 = sat_solver_solve(pSat,(lit *)0x0,(lit *)0x0,0,0,0,0);
  if (iVar2 == 0) {
    printf("Timeout reached after dumping %d untestable faults.\n",(ulong)uVar10);
  }
  if (1 < iVar2 + 1U) {
    p->nSize = 0;
    pVVar5 = pM->vCis;
    uVar6 = (ulong)(uint)pVVar5->nSize;
    if (pM->nRegs < pVVar5->nSize) {
      lVar11 = 0;
      do {
        if ((int)uVar6 <= lVar11) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = pVVar5->pArray[lVar11];
        if (((long)iVar2 < 0) || (pM->nObjs <= iVar2)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (pM->pObjs == (Gia_Obj_t *)0x0) break;
        if (nFuncVars <= lVar11) {
          if (pM->nObjs <= iVar2) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar2 = pCnf->pVarNums[iVar2];
          iVar3 = sat_solver_var_value(pSat,iVar2);
          if (iVar2 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf1,"int Abc_Var2Lit(int, int)");
          }
          Vec_IntPush(p,iVar3 + iVar2 * 2);
        }
        lVar11 = lVar11 + 1;
        pVVar5 = pM->vCis;
        uVar6 = (ulong)pVVar5->nSize;
      } while (lVar11 < (long)(uVar6 - (long)pM->nRegs));
    }
    uVar1 = p->nSize;
    uVar6 = (ulong)(int)uVar1;
    bVar12 = 0 < (long)uVar6;
    if (0 < (long)uVar6) {
      uVar7 = 1;
      do {
        if (p->pArray[uVar7 - 1] < 0) goto LAB_00535a41;
        if ((p->pArray[uVar7 - 1] & 1U) != 0) {
          if (bVar12) {
            if (fVerbose == 0) goto LAB_0053596b;
            local_58 = local_58 + 1;
            printf("Untestable fault %4d : ",(ulong)local_58);
            piVar4 = p->pArray;
            uVar7 = 0;
            goto LAB_0053592f;
          }
          break;
        }
        bVar12 = uVar7 < uVar6;
        bVar13 = uVar7 != uVar6;
        uVar7 = uVar7 + 1;
      } while (bVar13);
    }
    goto LAB_005359ca;
  }
  goto LAB_00535a07;
  while( true ) {
    if ((piVar4[uVar7] & 1U) != 0) {
      printf("%d ",uVar7 & 0xffffffff);
    }
    uVar7 = uVar7 + 1;
    if (uVar6 == uVar7) break;
LAB_0053592f:
    if (piVar4[uVar7] < 0) goto LAB_00535a41;
  }
  putchar(10);
LAB_0053596b:
  piVar4 = p->pArray;
  uVar7 = 1;
  if (1 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  uVar8 = 0;
  do {
    if (piVar4[uVar8] < 0) {
LAB_00535a41:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf3,"int Abc_LitIsCompl(int)");
    }
    if ((piVar4[uVar8] & 1U) != 0) {
      fprintf(__stream,"%d ",uVar8 & 0xffffffff);
    }
    uVar8 = uVar8 + 1;
  } while (uVar7 != uVar8);
  fputc(10,__stream);
LAB_005359ca:
  iVar2 = sat_solver_addclause(pSat,p->pArray,p->pArray + uVar6);
  if (iVar2 == 0) goto LAB_00535a07;
  uVar10 = uVar10 + 1;
  if (uVar10 == 10000) {
    uVar10 = 10000;
LAB_00535a07:
    if (p->pArray != (int *)0x0) {
      free(p->pArray);
      p->pArray = (int *)0x0;
    }
    free(p);
    fclose(__stream);
    return uVar10;
  }
  goto LAB_005357cb;
}

Assistant:

int Gia_ManDumpUntests( Gia_Man_t * pM, Cnf_Dat_t * pCnf, sat_solver * pSat, int nFuncVars, char * pFileName, int fVerbose )
{
    FILE * pFile = fopen( pFileName, "wb" );
    Vec_Int_t * vLits;
    Gia_Obj_t * pObj;
    int nItersMax = 10000;
    int i, nIters, status, Value, Count = 0;
    vLits = Vec_IntAlloc( Gia_ManPiNum(pM) - nFuncVars );
    for ( nIters = 0; nIters < nItersMax; nIters++ )
    {
        status = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_Undef )
            printf( "Timeout reached after dumping %d untestable faults.\n", nIters );
        if ( status == l_Undef )
            break;
        if ( status == l_False )
            break;
        // collect literals
        Vec_IntClear( vLits );
        Gia_ManForEachPi( pM, pObj, i )
            if ( i >= nFuncVars )
                Vec_IntPush( vLits, Abc_Var2Lit(pCnf->pVarNums[Gia_ObjId(pM, pObj)], sat_solver_var_value(pSat, pCnf->pVarNums[Gia_ObjId(pM, pObj)])) );
        // dump the fault
        Vec_IntForEachEntry( vLits, Value, i )
            if ( Abc_LitIsCompl(Value) )
                break;
        if ( i < Vec_IntSize(vLits) )
        {
            if ( fVerbose )
            {
                printf( "Untestable fault %4d : ", ++Count );
                Vec_IntForEachEntry( vLits, Value, i )
                    if ( Abc_LitIsCompl(Value) )
                        printf( "%d ", i );
                printf( "\n" );
            }
            Vec_IntForEachEntry( vLits, Value, i )
                if ( Abc_LitIsCompl(Value) )
                    fprintf( pFile, "%d ", i );
            fprintf( pFile, "\n" );
        }
        // add this clause
        if ( !sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) ) )
            break;
    }
    Vec_IntFree( vLits );
    fclose( pFile );
    return nIters;
}